

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_iterator.cpp
# Opt level: O0

entry_iterator * __thiscall Pathie::entry_iterator::operator++(entry_iterator *this,int param_1)

{
  char *pcVar1;
  range_error *this_00;
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  Pathie local_40 [32];
  dirent *local_20;
  dirent *p_dirent;
  entry_iterator *peStack_10;
  int param_1_local;
  entry_iterator *this_local;
  
  p_dirent._4_4_ = param_1;
  peStack_10 = this;
  if (this->mp_cur != (void *)0x0) {
    local_20 = readdir((DIR *)this->mp_cur);
    if (local_20 == (dirent *)0x0) {
      close_native_handle(this);
    }
    else {
      pcVar1 = local_20->d_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,pcVar1,&local_61);
      filename_to_utf8(local_40,(string *)local_60);
      Path::operator=(this->mp_cur_path,(string *)local_40);
      std::__cxx11::string::~string((string *)local_40);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
    return this;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Tried to advance a finished entry_iterator!",&local_99);
  std::range_error::range_error(this_00,local_98);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

entry_iterator& entry_iterator::operator++(int)
{
  if (mp_cur) {
#if defined(_PATHIE_UNIX)
    struct dirent* p_dirent = readdir(static_cast<DIR*>(mp_cur));
    if (p_dirent) {
      *mp_cur_path = filename_to_utf8(p_dirent->d_name);
    }
    else {
      close_native_handle();
    }
#elif defined(_WIN32)
    WIN32_FIND_DATAW finddata;
    if (FindNextFileW(static_cast<HANDLE>(mp_cur), &finddata)) {
      *mp_cur_path = utf16_to_utf8(finddata.cFileName);
    }
    else {
      close_native_handle();
    }
#else
#error Unsupported system
#endif
  }
  else { // Finished already
    throw(std::range_error("Tried to advance a finished entry_iterator!"));
  }

  return *this;
}